

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O1

xmlCharEncodingHandlerPtr xmlFindCharEncodingHandler(char *name)

{
  __int32_t _Var1;
  bool bVar2;
  xmlCharEncodingHandlerPtr *ppxVar3;
  int iVar4;
  xmlCharEncoding enc;
  char *pcVar5;
  __int32_t **pp_Var6;
  iconv_t __cd;
  iconv_t __cd_00;
  xmlCharEncodingHandlerPtr pxVar7;
  char *__s2;
  long lVar8;
  xmlCharEncodingHandlerPtr unaff_R13;
  long lVar9;
  ulong uVar10;
  char upper [100];
  char local_98 [104];
  
  if (handlers == (xmlCharEncodingHandlerPtr *)0x0) {
    xmlInitCharEncodingHandlers();
  }
  if ((name != (char *)0x0) && (*name != '\0')) {
    pcVar5 = xmlGetEncodingAlias(name);
    if (pcVar5 == (char *)0x0) {
      pcVar5 = name;
    }
    uVar10 = 0;
    pp_Var6 = __ctype_toupper_loc();
    ppxVar3 = handlers;
    do {
      _Var1 = (*pp_Var6)[pcVar5[uVar10]];
      local_98[uVar10] = (char)_Var1;
      if ((char)_Var1 == '\0') goto LAB_00144db8;
      uVar10 = uVar10 + 1;
    } while (uVar10 != 99);
    uVar10 = 99;
LAB_00144db8:
    local_98[uVar10 & 0xffffffff] = '\0';
    if ((handlers != (xmlCharEncodingHandlerPtr *)0x0) &&
       (lVar8 = (long)nbCharEncodingHandler, 0 < lVar8)) {
      lVar9 = 0;
      do {
        unaff_R13 = ppxVar3[lVar9];
        iVar4 = strcmp(local_98,unaff_R13->name);
        if (iVar4 == 0) {
          return unaff_R13;
        }
        lVar9 = lVar9 + 1;
      } while (lVar8 != lVar9);
    }
    __cd = iconv_open("UTF-8",pcVar5);
    __cd_00 = iconv_open(pcVar5,"UTF-8");
    if (__cd == (iconv_t)0xffffffffffffffff) {
      __cd = iconv_open("UTF-8",local_98);
    }
    if (__cd_00 == (iconv_t)0xffffffffffffffff) {
      __cd_00 = iconv_open(local_98,"UTF-8");
    }
    if (__cd_00 == (iconv_t)0xffffffffffffffff || __cd == (iconv_t)0xffffffffffffffff) {
      if (((ulong)__cd & (ulong)__cd_00) != 0xffffffffffffffff) {
        __xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,(void *)0x0
                        ,(void *)0x0,0x1b,1,XML_ERR_FATAL,(char *)0x0,0,pcVar5,(char *)0x0,
                        (char *)0x0,0,0,"iconv : problems with filters for \'%s\'\n",pcVar5);
      }
      enc = xmlParseCharEncoding(name);
      if (enc != XML_CHAR_ENCODING_ERROR) {
        __s2 = xmlGetCharEncodingName(enc);
        bVar2 = true;
        if ((__s2 != (char *)0x0) && (iVar4 = strcmp(pcVar5,__s2), iVar4 != 0)) {
          unaff_R13 = xmlFindCharEncodingHandler(__s2);
          bVar2 = false;
        }
        if (!bVar2) {
          return unaff_R13;
        }
      }
    }
    else {
      pxVar7 = (xmlCharEncodingHandlerPtr)(*xmlMalloc)(0x28);
      if (pxVar7 != (xmlCharEncodingHandlerPtr)0x0) {
        pxVar7->output = (xmlCharEncodingOutputFunc)0x0;
        pxVar7->iconv_in = (iconv_t)0x0;
        pxVar7->name = (char *)0x0;
        pxVar7->input = (xmlCharEncodingInputFunc)0x0;
        pxVar7->iconv_out = (iconv_t)0x0;
        pcVar5 = (*xmlMemStrdup)(pcVar5);
        pxVar7->name = pcVar5;
        pxVar7->input = (xmlCharEncodingInputFunc)0x0;
        pxVar7->output = (xmlCharEncodingOutputFunc)0x0;
        pxVar7->iconv_in = __cd;
        pxVar7->iconv_out = __cd_00;
        return pxVar7;
      }
      iconv_close(__cd);
      iconv_close(__cd_00);
    }
  }
  return (xmlCharEncodingHandlerPtr)0x0;
}

Assistant:

xmlCharEncodingHandlerPtr
xmlFindCharEncodingHandler(const char *name) {
    const char *nalias;
    const char *norig;
    xmlCharEncoding alias;
#ifdef LIBXML_ICONV_ENABLED
    xmlCharEncodingHandlerPtr enc;
    iconv_t icv_in, icv_out;
#endif /* LIBXML_ICONV_ENABLED */
#ifdef LIBXML_ICU_ENABLED
    xmlCharEncodingHandlerPtr encu;
    uconv_t *ucv_in, *ucv_out;
#endif /* LIBXML_ICU_ENABLED */
    char upper[100];
    int i;

    if (handlers == NULL) xmlInitCharEncodingHandlers();
    if (name == NULL) return(xmlDefaultCharEncodingHandler);
    if (name[0] == 0) return(xmlDefaultCharEncodingHandler);

    /*
     * Do the alias resolution
     */
    norig = name;
    nalias = xmlGetEncodingAlias(name);
    if (nalias != NULL)
	name = nalias;

    /*
     * Check first for directly registered encoding names
     */
    for (i = 0;i < 99;i++) {
        upper[i] = toupper(name[i]);
	if (upper[i] == 0) break;
    }
    upper[i] = 0;

    if (handlers != NULL) {
        for (i = 0;i < nbCharEncodingHandler; i++) {
            if (!strcmp(upper, handlers[i]->name)) {
#ifdef DEBUG_ENCODING
                xmlGenericError(xmlGenericErrorContext,
                        "Found registered handler for encoding %s\n", name);
#endif
                return(handlers[i]);
            }
        }
    }

#ifdef LIBXML_ICONV_ENABLED
    /* check whether iconv can handle this */
    icv_in = iconv_open("UTF-8", name);
    icv_out = iconv_open(name, "UTF-8");
    if (icv_in == (iconv_t) -1) {
        icv_in = iconv_open("UTF-8", upper);
    }
    if (icv_out == (iconv_t) -1) {
	icv_out = iconv_open(upper, "UTF-8");
    }
    if ((icv_in != (iconv_t) -1) && (icv_out != (iconv_t) -1)) {
	    enc = (xmlCharEncodingHandlerPtr)
	          xmlMalloc(sizeof(xmlCharEncodingHandler));
	    if (enc == NULL) {
	        iconv_close(icv_in);
	        iconv_close(icv_out);
		return(NULL);
	    }
            memset(enc, 0, sizeof(xmlCharEncodingHandler));
	    enc->name = xmlMemStrdup(name);
	    enc->input = NULL;
	    enc->output = NULL;
	    enc->iconv_in = icv_in;
	    enc->iconv_out = icv_out;
#ifdef DEBUG_ENCODING
            xmlGenericError(xmlGenericErrorContext,
		    "Found iconv handler for encoding %s\n", name);
#endif
	    return enc;
    } else if ((icv_in != (iconv_t) -1) || icv_out != (iconv_t) -1) {
	    xmlEncodingErr(XML_ERR_INTERNAL_ERROR,
		    "iconv : problems with filters for '%s'\n", name);
    }
#endif /* LIBXML_ICONV_ENABLED */
#ifdef LIBXML_ICU_ENABLED
    /* check whether icu can handle this */
    ucv_in = openIcuConverter(name, 1);
    ucv_out = openIcuConverter(name, 0);
    if (ucv_in != NULL && ucv_out != NULL) {
	    encu = (xmlCharEncodingHandlerPtr)
	           xmlMalloc(sizeof(xmlCharEncodingHandler));
	    if (encu == NULL) {
                closeIcuConverter(ucv_in);
                closeIcuConverter(ucv_out);
		return(NULL);
	    }
            memset(encu, 0, sizeof(xmlCharEncodingHandler));
	    encu->name = xmlMemStrdup(name);
	    encu->input = NULL;
	    encu->output = NULL;
	    encu->uconv_in = ucv_in;
	    encu->uconv_out = ucv_out;
#ifdef DEBUG_ENCODING
            xmlGenericError(xmlGenericErrorContext,
		    "Found ICU converter handler for encoding %s\n", name);
#endif
	    return encu;
    } else if (ucv_in != NULL || ucv_out != NULL) {
            closeIcuConverter(ucv_in);
            closeIcuConverter(ucv_out);
	    xmlEncodingErr(XML_ERR_INTERNAL_ERROR,
		    "ICU converter : problems with filters for '%s'\n", name);
    }
#endif /* LIBXML_ICU_ENABLED */

#ifdef DEBUG_ENCODING
    xmlGenericError(xmlGenericErrorContext,
	    "No handler found for encoding %s\n", name);
#endif

    /*
     * Fallback using the canonical names
     */
    alias = xmlParseCharEncoding(norig);
    if (alias != XML_CHAR_ENCODING_ERROR) {
        const char* canon;
        canon = xmlGetCharEncodingName(alias);
        if ((canon != NULL) && (strcmp(name, canon))) {
	    return(xmlFindCharEncodingHandler(canon));
        }
    }

    /* If "none of the above", give up */
    return(NULL);
}